

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_state.cpp
# Opt level: O0

void __thiscall ccs::SearchState::append(SearchState *this,ostream *out,bool isPrefix)

{
  bool bVar1;
  element_type *this_00;
  byte local_29;
  bool isPrefix_local;
  ostream *out_local;
  SearchState *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->parent);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_ccs::SearchState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->parent);
    local_29 = 1;
    if (!isPrefix) {
      bVar1 = Key::empty(&this->key);
      local_29 = bVar1 ^ 0xff;
    }
    append(this_00,out,(bool)(local_29 & 1));
  }
  else {
    bVar1 = Key::empty(&this->key);
    if ((bVar1) && (!isPrefix)) {
      std::operator<<(out,"<root>");
      return;
    }
  }
  bVar1 = Key::empty(&this->key);
  if ((!bVar1) && (ccs::operator<<(out,&this->key), isPrefix)) {
    std::operator<<(out," > ");
  }
  return;
}

Assistant:

void SearchState::append(std::ostream &out, bool isPrefix) const {
  if (parent) {
    parent->append(out, isPrefix || !key.empty());
  } else if (key.empty() && !isPrefix) {
    out << "<root>";
    return;
  }

  if (!key.empty()) {
    out << key;
    if (isPrefix) out << " > ";
  }
}